

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fUniformApiTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Functional::UniformCase::generateVertexSource_abi_cxx11_
          (string *__return_storage_ptr__,UniformCase *this,
          vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
          *basicUniforms)

{
  bool local_1ad;
  undefined1 local_1a0 [8];
  ostringstream result;
  bool isVertexCase;
  vector<deqp::gles3::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles3::Functional::UniformCase::BasicUniform>_>
  *basicUniforms_local;
  UniformCase *this_local;
  
  local_1ad = true;
  if (this->m_caseShaderType != CASESHADERTYPE_VERTEX) {
    local_1ad = this->m_caseShaderType == CASESHADERTYPE_BOTH;
  }
  result._375_1_ = local_1ad;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::operator<<((ostream *)local_1a0,
                  "#version 300 es\nin highp vec4 a_position;\nout mediump float v_vtxOut;\n\n");
  if ((result._375_1_ & 1) != 0) {
    writeUniformDefinitions(this,(ostringstream *)local_1a0);
  }
  std::operator<<((ostream *)local_1a0,
                  "\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_vtxOut = 1.0;\n");
  if ((result._375_1_ & 1) != 0) {
    writeUniformComparisons(this,(ostringstream *)local_1a0,basicUniforms,"v_vtxOut");
  }
  std::operator<<((ostream *)local_1a0,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string UniformCase::generateVertexSource (const vector<BasicUniform>& basicUniforms) const
{
	const bool			isVertexCase = m_caseShaderType == CASESHADERTYPE_VERTEX || m_caseShaderType == CASESHADERTYPE_BOTH;
	std::ostringstream	result;

	result << "#version 300 es\n"
			  "in highp vec4 a_position;\n"
			  "out mediump float v_vtxOut;\n"
			  "\n";

	if (isVertexCase)
		writeUniformDefinitions(result);

	result << "\n"
			  "void main (void)\n"
			  "{\n"
			  "	gl_Position = a_position;\n"
			  "	v_vtxOut = 1.0;\n";

	if (isVertexCase)
		writeUniformComparisons(result, basicUniforms, "v_vtxOut");

	result << "}\n";

	return result.str();
}